

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

parser_error parser_parse(parser *p,char *line)

{
  bool bVar1;
  _Bool _Var2;
  int iVar3;
  parser_error pVar4;
  ushort **ppuVar5;
  char *pcVar6;
  char *pcVar7;
  parser_value *p_00;
  long lVar8;
  ulong uVar9;
  parser_value *ppVar10;
  char cVar11;
  uint uVar12;
  parser_hook *ppVar13;
  uint uVar14;
  char cVar15;
  parser_spec *ppVar16;
  char *z;
  undefined8 local_68;
  undefined8 uStack_60;
  char *local_58;
  char *local_50;
  ulong local_48;
  parser_value *local_40;
  char *local_38;
  
  if (p == (parser *)0x0) {
    __assert_fail("p",
                  "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/parser.c"
                  ,0xda,"enum parser_error parser_parse(struct parser *, const char *)");
  }
  if (line == (char *)0x0) {
    __assert_fail("line",
                  "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/parser.c"
                  ,0xdb,"enum parser_error parser_parse(struct parser *, const char *)");
  }
  parser_freeold(p);
  p->lineno = p->lineno + 1;
  p->colno = 1;
  p->fhead = (parser_value *)0x0;
  p->ftail = (parser_value *)0x0;
  cVar15 = *line;
  pVar4 = PARSE_ERROR_NONE;
  if (cVar15 == '\0') {
    return PARSE_ERROR_NONE;
  }
  ppuVar5 = __ctype_b_loc();
  while ((*(byte *)((long)*ppuVar5 + (long)cVar15 * 2 + 1) & 0x20) != 0) {
    cVar15 = line[1];
    line = line + 1;
    if (cVar15 == '\0') {
      return PARSE_ERROR_NONE;
    }
  }
  if (cVar15 == '\0') {
    return PARSE_ERROR_NONE;
  }
  if (cVar15 == '#') {
    return PARSE_ERROR_NONE;
  }
  pcVar6 = string_make(line);
  pcVar7 = strtok(pcVar6,":");
  if (pcVar7 == (char *)0x0) {
    mem_free(pcVar6);
    p->error = PARSE_ERROR_MISSING_FIELD;
    return PARSE_ERROR_MISSING_FIELD;
  }
  ppVar13 = (parser_hook *)&p->hooks;
  local_40 = (parser_value *)&p->fhead;
  do {
    ppVar13 = ppVar13->next;
    if (ppVar13 == (parser_hook *)0x0) goto LAB_001b0d86;
    iVar3 = strcmp(ppVar13->dir,pcVar7);
  } while (iVar3 != 0);
  if (ppVar13 == (parser_hook *)0x0) {
LAB_001b0d86:
    my_strcpy(p->errmsg,pcVar7,0x400);
    p->error = PARSE_ERROR_UNDEFINED_DIRECTIVE;
    mem_free(pcVar6);
    pVar4 = PARSE_ERROR_UNDEFINED_DIRECTIVE;
  }
  else {
    ppVar16 = (parser_spec *)&ppVar13->fhead;
    local_50 = p->errmsg;
    pcVar7 = (char *)0x0;
    local_58 = pcVar6;
    do {
      ppVar16 = ppVar16->next;
      if (ppVar16 == (parser_spec *)0x0) goto LAB_001b0dc6;
      uVar12 = ppVar16->type;
      uVar14 = uVar12 & 0xfffffffe;
      p->colno = p->colno + 1;
      if ((uVar12 < 0xc) && ((0xf3cU >> (uVar12 & 0x1f) & 1) != 0)) {
        pcVar6 = strtok(pcVar7,":");
LAB_001b08f7:
        pcVar7 = (char *)0x0;
LAB_001b08f9:
        if (pcVar6 == (char *)0x0) {
          iVar3 = 4;
          if ((ppVar16->type & 1) != 0) goto LAB_001b0cac;
          my_strcpy(local_50,ppVar16->name,0x400);
          p->error = PARSE_ERROR_MISSING_FIELD;
          mem_free(local_58);
          pVar4 = PARSE_ERROR_MISSING_FIELD;
          goto LAB_001b0a00;
        }
        p_00 = (parser_value *)mem_alloc(0x28);
        (p_00->spec).next = (parser_spec *)0x0;
        (p_00->spec).type = ppVar16->type;
        (p_00->spec).name = ppVar16->name;
        if (uVar14 == 0xc) {
          text_mbstowcs(&(p_00->u).cval,pcVar6,L'\x01');
LAB_001b0c8e:
          ppVar10 = local_40;
          if ((parser_value *)(local_40->spec).next != (parser_value *)0x0) {
            ppVar10 = p->ftail;
          }
          (ppVar10->spec).next = (parser_spec *)p_00;
          p->ftail = p_00;
          iVar3 = 0;
        }
        else {
          if (uVar14 != 10) {
            if (uVar14 == 2) {
              local_68 = (char *)0x0;
              lVar8 = strtol(pcVar6,(char **)&local_68,0);
              (p_00->u).cval = (wchar_t)lVar8;
              if (local_68 == pcVar6) {
                mem_free(p_00);
                mem_free(local_58);
                my_strcpy(local_50,ppVar16->name,0x400);
                p->error = PARSE_ERROR_NOT_NUMBER;
                pVar4 = PARSE_ERROR_NOT_NUMBER;
LAB_001b0d3f:
                iVar3 = 1;
                goto LAB_001b0cac;
              }
            }
            else if ((uVar12 & 0xfffffffc) == 4) {
              pcVar6 = string_make(pcVar6);
              (p_00->u).sval = pcVar6;
            }
            else if (uVar14 == 8) {
              local_68 = (char *)0x0;
              uStack_60 = 0;
              cVar15 = *pcVar6;
              pcVar6 = pcVar6 + (cVar15 == '-');
              iVar3 = 1;
              uVar12 = 0;
              do {
                while( true ) {
                  for (; *pcVar6 == 'M'; pcVar6 = pcVar6 + 1) {
                    if (uVar12 == 2) goto LAB_001b0d0d;
                    iVar3 = 4;
                    uVar12 = 3;
                  }
                  if (*pcVar6 != 'd') break;
                  if (2 < (int)uVar12) goto LAB_001b0d0d;
                  if (uVar12 != 2) {
                    local_68 = (char *)CONCAT44(1,(wchar_t)local_68);
                  }
                  pcVar6 = pcVar6 + 1;
                  iVar3 = 3;
                  uVar12 = 2;
                }
                uVar9 = strtoul(pcVar6,&local_38,10);
                if (local_38 == pcVar6) {
                  _Var2 = contains_only_spaces(pcVar6);
                  cVar11 = (iVar3 <= (int)uVar12 && _Var2) * '\x02' + '\x01';
                }
                else {
                  cVar11 = '\x01';
                  if (((uVar9 < 0x80000000) && (*pcVar6 != '+')) && (pcVar6 = local_38, uVar12 != 4)
                     ) {
                    if (uVar12 == 0) {
                      if (*local_38 == 'd') {
                        uVar12 = 1;
                      }
                      else {
                        if (*local_38 != '+') {
                          local_48 = uVar9;
                          _Var2 = contains_only_spaces(local_38);
                          cVar11 = '\x01';
                          uVar12 = 0;
                          if (_Var2) {
                            local_68 = (char *)CONCAT44(local_68._4_4_,(int)local_48);
                            cVar11 = '\x03';
                          }
                          goto LAB_001b0c42;
                        }
                        iVar3 = 3;
                        uVar12 = 0;
                        pcVar6 = local_38 + 1;
                      }
                    }
                    *(int *)((long)&local_68 + (ulong)uVar12 * 4) = (int)uVar9;
                    uVar12 = uVar12 + 1;
                    cVar11 = '\0';
                  }
                }
LAB_001b0c42:
              } while (cVar11 == '\0');
              if (cVar11 != '\x03') {
LAB_001b0d0d:
                mem_free(p_00);
                mem_free(local_58);
                my_strcpy(local_50,ppVar16->name,0x400);
                p->error = PARSE_ERROR_NOT_RANDOM;
                pVar4 = PARSE_ERROR_NOT_RANDOM;
                goto LAB_001b0d3f;
              }
              (p_00->u).cval = (wchar_t)local_68;
              (p_00->u).rval.dice = local_68._4_4_;
              (p_00->u).rval.sides = (wchar_t)uStack_60;
              (p_00->u).rval.m_bonus = uStack_60._4_4_;
              if (cVar15 == '-') {
                (p_00->u).cval =
                     local_68._4_4_ * ~(wchar_t)uStack_60 - ((wchar_t)local_68 + uStack_60._4_4_);
              }
            }
            goto LAB_001b0c8e;
          }
          local_68 = (char *)0x0;
          uVar9 = strtoul(pcVar6,(char **)&local_68,0);
          (p_00->u).cval = (wchar_t)uVar9;
          if ((local_68 == pcVar6) || (bVar1 = true, *pcVar6 == '-')) {
            mem_free(p_00);
            mem_free(local_58);
            my_strcpy(local_50,ppVar16->name,0x400);
            p->error = PARSE_ERROR_NOT_NUMBER;
            pVar4 = PARSE_ERROR_NOT_NUMBER;
            bVar1 = false;
          }
          iVar3 = 1;
          if (bVar1) goto LAB_001b0c8e;
        }
      }
      else {
        pcVar6 = strtok(pcVar7,"");
        if (uVar14 != 0xc) goto LAB_001b08f7;
        if (pcVar6 == (char *)0x0) {
          pcVar6 = (char *)0x0;
          goto LAB_001b08f9;
        }
        pcVar7 = utf8_fskip(pcVar6,1,(char *)0x0);
        if (pcVar7 == (char *)0x0) goto LAB_001b08f7;
        if (*pcVar7 == '\0') goto LAB_001b08f9;
        if (*pcVar7 == ':') {
          pcVar7 = pcVar7 + 1;
          goto LAB_001b08f9;
        }
        my_strcpy(local_50,ppVar16->name,0x400);
        p->error = PARSE_ERROR_FIELD_TOO_LONG;
        mem_free(local_58);
        pVar4 = PARSE_ERROR_FIELD_TOO_LONG;
LAB_001b0a00:
        iVar3 = 1;
      }
LAB_001b0cac:
    } while (iVar3 == 0);
    if (iVar3 == 4) {
LAB_001b0dc6:
      mem_free(local_58);
      pVar4 = (*ppVar13->func)(p);
      p->error = pVar4;
    }
  }
  return pVar4;
}

Assistant:

enum parser_error parser_parse(struct parser *p, const char *line) {
	char *cline;
	char *tok;
	struct parser_hook *h;
	struct parser_spec *s;
	struct parser_value *v;
	char *sp = NULL;

	assert(p);
	assert(line);

	parser_freeold(p);

	p->lineno++;
	p->colno = 1;
	p->fhead = NULL;
	p->ftail = NULL;

	/* Ignore empty lines and comments. */
	while (*line && (isspace(*line)))
		line++;
	if (!*line || *line == '#')
		return PARSE_ERROR_NONE;

	cline = string_make(line);

	tok = strtok(cline, ":");
	if (!tok) {
		mem_free(cline);
		p->error = PARSE_ERROR_MISSING_FIELD;
		return PARSE_ERROR_MISSING_FIELD;
	}

	h = findhook(p, tok);
	if (!h) {
		my_strcpy(p->errmsg, tok, sizeof(p->errmsg));
		p->error = PARSE_ERROR_UNDEFINED_DIRECTIVE;
		mem_free(cline);
		return PARSE_ERROR_UNDEFINED_DIRECTIVE;
	}

	/* There's a little bit of trickiness here to account for optional
	 * types. The optional flag has a bit assigned to it in the spec's type
	 * tag; we compute a temporary type for the spec with that flag removed
	 * and use that instead. */
	for (s = h->fhead; s; s = s->next) {
		int t = s->type & ~PARSE_T_OPT;
		p->colno++;

		/* These types are tokenized on ':'; strings are not tokenized
		 * at all (i.e., they consume the remainder of the line) */
		if (t == PARSE_T_INT || t == PARSE_T_SYM || t == PARSE_T_RAND ||
			t == PARSE_T_UINT) {
			tok = strtok(sp, ":");
			sp = NULL;
		} else if (t == PARSE_T_CHAR) {
			tok = strtok(sp, "");
			if (tok) {
				sp = utf8_fskip(tok, 1, NULL);
				if (sp) {
					if (*sp == ':') {
						++sp;
					} else if (*sp) {
						my_strcpy(p->errmsg, s->name,
							sizeof(p->errmsg));
						p->error = PARSE_ERROR_FIELD_TOO_LONG;
						mem_free(cline);
						return PARSE_ERROR_FIELD_TOO_LONG;
					}
				}
			}
		} else {
			tok = strtok(sp, "");
			sp = NULL;
		}
		if (!tok) {
			if (!(s->type & PARSE_T_OPT)) {
				my_strcpy(p->errmsg, s->name, sizeof(p->errmsg));
				p->error = PARSE_ERROR_MISSING_FIELD;
				mem_free(cline);
				return PARSE_ERROR_MISSING_FIELD;
			}
			break;
		}

		/* Allocate a value node. */
		v = mem_alloc(sizeof *v);
		v->spec.next = NULL;
		v->spec.type = s->type;
		v->spec.name = s->name;

		/* Parse out its value. */
		if (t == PARSE_T_INT) {
			char *z = NULL;
			v->u.ival = strtol(tok, &z, 0);
			if (z == tok) {
				mem_free(v);
				mem_free(cline);
				my_strcpy(p->errmsg, s->name, sizeof(p->errmsg));
				p->error = PARSE_ERROR_NOT_NUMBER;
				return PARSE_ERROR_NOT_NUMBER;
			}
		} else if (t == PARSE_T_UINT) {
			char *z = NULL;
			v->u.uval = strtoul(tok, &z, 0);
			if (z == tok || *tok == '-') {
				mem_free(v);
				mem_free(cline);
				my_strcpy(p->errmsg, s->name, sizeof(p->errmsg));
				p->error = PARSE_ERROR_NOT_NUMBER;
				return PARSE_ERROR_NOT_NUMBER;
			}
		} else if (t == PARSE_T_CHAR) {
			text_mbstowcs(&v->u.cval, tok, 1);
		} else if (t == PARSE_T_SYM || t == PARSE_T_STR) {
			v->u.sval = string_make(tok);
		} else if (t == PARSE_T_RAND) {
			if (!parse_random(tok, &v->u.rval)) {
				mem_free(v);
				mem_free(cline);
				my_strcpy(p->errmsg, s->name, sizeof(p->errmsg));
				p->error = PARSE_ERROR_NOT_RANDOM;
				return PARSE_ERROR_NOT_RANDOM;
			}
		}

		/* Link it into the value list. */
		if (!p->fhead)
			p->fhead = v;
		else
			p->ftail->spec.next = &v->spec;
		p->ftail = v;
	}

	mem_free(cline);

	p->error = h->func(p);
	return p->error;
}